

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void ft_glyphslot_done(FT_GlyphSlot slot)

{
  FT_Driver pFVar1;
  FT_Driver_Class pFVar2;
  FT_Memory memory_00;
  undefined8 *puVar3;
  FT_SVG_Document doc;
  FT_Memory memory;
  FT_Driver_Class clazz;
  FT_Driver driver;
  FT_GlyphSlot slot_local;
  
  pFVar1 = slot->face->driver;
  pFVar2 = pFVar1->clazz;
  memory_00 = (pFVar1->root).memory;
  if ((slot->face->face_flags & 0x10000U) != 0) {
    if ((slot->internal != (FT_Slot_Internal)0x0) && ((slot->internal->flags & 2) != 0)) {
      puVar3 = (undefined8 *)slot->other;
      ft_mem_free(memory_00,(void *)*puVar3);
      *puVar3 = 0;
      slot->internal->flags = slot->internal->flags & 0xfffffffd;
    }
    ft_mem_free(memory_00,slot->other);
    slot->other = (void *)0x0;
  }
  if (pFVar2->done_slot != (FT_Slot_DoneFunc)0x0) {
    (*pFVar2->done_slot)(slot);
  }
  ft_glyphslot_free_bitmap(slot);
  if (slot->internal != (FT_Slot_Internal)0x0) {
    if ((((pFVar1->root).clazz)->module_flags & 0x200) == 0) {
      FT_GlyphLoader_Done(slot->internal->loader);
      slot->internal->loader = (FT_GlyphLoader)0x0;
    }
    ft_mem_free(memory_00,slot->internal);
    slot->internal = (FT_Slot_Internal)0x0;
  }
  return;
}

Assistant:

static void
  ft_glyphslot_done( FT_GlyphSlot  slot )
  {
    FT_Driver        driver = slot->face->driver;
    FT_Driver_Class  clazz  = driver->clazz;
    FT_Memory        memory = driver->root.memory;

#ifdef FT_CONFIG_OPTION_SVG
    if ( slot->face->face_flags & FT_FACE_FLAG_SVG )
    {
      /* Free memory in case SVG was there.                          */
      /* `slot->internal` might be NULL in out-of-memory situations. */
      if ( slot->internal && slot->internal->flags & FT_GLYPH_OWN_GZIP_SVG )
      {
        FT_SVG_Document  doc = (FT_SVG_Document)slot->other;


        FT_FREE( doc->svg_document );

        slot->internal->flags &= ~FT_GLYPH_OWN_GZIP_SVG;
      }

      FT_FREE( slot->other );
    }
#endif

    if ( clazz->done_slot )
      clazz->done_slot( slot );

    /* free bitmap buffer if needed */
    ft_glyphslot_free_bitmap( slot );

    /* slot->internal might be NULL in out-of-memory situations */
    if ( slot->internal )
    {
      /* free glyph loader */
      if ( FT_DRIVER_USES_OUTLINES( driver ) )
      {
        FT_GlyphLoader_Done( slot->internal->loader );
        slot->internal->loader = NULL;
      }

      FT_FREE( slot->internal );
    }
  }